

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_filter_bank_analysis.cc
# Opt level: O1

bool __thiscall
sptk::MelFilterBankAnalysis::Run
          (MelFilterBankAnalysis *this,vector<double,_std::allocator<double>_> *power_spectrum,
          vector<double,_std::allocator<double>_> *filter_bank_output,double *energy)

{
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  double *pdVar6;
  bool bVar7;
  long lVar8;
  double dVar9;
  
  if (this->is_valid_ == true) {
    bVar7 = false;
    if ((filter_bank_output != (vector<double,_std::allocator<double>_> *)0x0) &&
       (bVar7 = false,
       (long)(power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == (long)(this->fft_length_ / 2 + 1))) {
      if ((long)(filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)this->num_channel_) {
        std::vector<double,_std::allocator<double>_>::resize
                  (filter_bank_output,(long)this->num_channel_);
      }
      pdVar2 = (filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar2 != pdVar3) {
        memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
      }
      lVar8 = (long)this->lower_bin_index_;
      if (this->lower_bin_index_ < this->upper_bin_index_) {
        piVar4 = (this->channel_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->channel_weights_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          uVar1 = piVar4[lVar8];
          dVar9 = pdVar5[lVar8];
          if (this->use_power_ == false) {
            if (dVar9 < 0.0) {
              dVar9 = sqrt(dVar9);
            }
            else {
              dVar9 = SQRT(dVar9);
            }
          }
          if (0 < (int)uVar1) {
            pdVar2[(ulong)uVar1 - 1] = pdVar3[lVar8] * dVar9 + pdVar2[(ulong)uVar1 - 1];
          }
          if ((int)uVar1 < this->num_channel_) {
            pdVar2[(int)uVar1] = dVar9 * (1.0 - pdVar3[lVar8]) + pdVar2[(int)uVar1];
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < this->upper_bin_index_);
      }
      if (0 < this->num_channel_) {
        lVar8 = 0;
        do {
          dVar9 = this->floor_;
          if (pdVar2[lVar8] <= dVar9 && dVar9 != pdVar2[lVar8]) {
            pdVar2[lVar8] = dVar9;
          }
          dVar9 = log(pdVar2[lVar8]);
          pdVar2[lVar8] = dVar9;
          lVar8 = lVar8 + 1;
        } while (lVar8 < this->num_channel_);
      }
      bVar7 = true;
      if (energy != (double *)0x0) {
        pdVar6 = (power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        dVar9 = *pdVar6 + pdVar2[-1];
        while (pdVar6 = pdVar6 + 1, pdVar6 != pdVar2 + -1) {
          dVar9 = dVar9 + *pdVar6 + *pdVar6;
        }
        dVar9 = log(dVar9 / (double)this->fft_length_);
        *energy = dVar9;
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool MelFilterBankAnalysis::Run(const std::vector<double>& power_spectrum,
                                std::vector<double>* filter_bank_output,
                                double* energy) const {
  // Check inputs.
  if (!is_valid_ ||
      power_spectrum.size() != static_cast<std::size_t>(fft_length_ / 2 + 1) ||
      NULL == filter_bank_output) {
    return false;
  }

  // Prepare memories.
  if (filter_bank_output->size() != static_cast<std::size_t>(num_channel_)) {
    filter_bank_output->resize(num_channel_);
  }

  std::fill(filter_bank_output->begin(), filter_bank_output->end(), 0.0);

  // Apply mel-filter-banks.
  const int* map(&(channel_indices_[0]));
  const double* w(&(channel_weights_[0]));
  const double* input(&(power_spectrum[0]));
  double* output(&((*filter_bank_output)[0]));
  for (int k(lower_bin_index_); k < upper_bin_index_; ++k) {
    const int m(map[k]);
    const double x(use_power_ ? input[k] : std::sqrt(input[k]));
    if (0 < m) {
      output[m - 1] += x * w[k];
    }
    if (m < num_channel_) {
      output[m] += x * (1.0 - w[k]);
    }
  }

  // Apply logarithm function.
  for (int m(0); m < num_channel_; ++m) {
    if (output[m] < floor_) output[m] = floor_;
    output[m] = std::log(output[m]);
  }

  if (NULL != energy) {
    const double sum(
        std::accumulate(power_spectrum.begin() + 1, power_spectrum.end() - 1,
                        power_spectrum.front() + power_spectrum.back(),
                        [](double a, double x) { return a + 2.0 * x; }));
    *energy = std::log(sum / fft_length_);
  }

  return true;
}